

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktWsiSwapchainTests.cpp
# Opt level: O0

vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>_>_>
* vkt::wsi::anon_unknown_0::createFences
            (vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>_>_>
             *__return_storage_ptr__,DeviceInterface *vkd,VkDevice device,size_t numFences)

{
  RefData<vk::Handle<(vk::HandleType)6>_> data;
  Unique<vk::Handle<(vk::HandleType)6>_> *this;
  reference this_00;
  Move<vk::Handle<(vk::HandleType)6>_> local_98;
  RefData<vk::Handle<(vk::HandleType)6>_> local_78;
  SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_> local_58;
  ulong local_48;
  size_t ndx;
  allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>_> local_2a;
  undefined1 local_29;
  size_t local_28;
  size_t numFences_local;
  VkDevice device_local;
  DeviceInterface *vkd_local;
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>_>_>
  *fences;
  
  local_29 = 0;
  local_28 = numFences;
  numFences_local = (size_t)device;
  device_local = (VkDevice)vkd;
  vkd_local = (DeviceInterface *)__return_storage_ptr__;
  std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>_>::allocator
            (&local_2a);
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>_>_>
  ::vector(__return_storage_ptr__,numFences,&local_2a);
  std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>_>::
  ~allocator(&local_2a);
  for (local_48 = 0; local_48 < local_28; local_48 = local_48 + 1) {
    this = (Unique<vk::Handle<(vk::HandleType)6>_> *)operator_new(0x20);
    ::vk::createFence(&local_98,(DeviceInterface *)device_local,(VkDevice)numFences_local,0,
                      (VkAllocationCallbacks *)0x0);
    ::vk::refdetails::Move::operator_cast_to_RefData(&local_78,(Move *)&local_98);
    data.deleter.m_deviceIface = local_78.deleter.m_deviceIface;
    data.object.m_internal = local_78.object.m_internal;
    data.deleter.m_device = local_78.deleter.m_device;
    data.deleter.m_allocator = local_78.deleter.m_allocator;
    ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>::Unique(this,data);
    de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>::SharedPtr
              (&local_58,this);
    this_00 = std::
              vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>_>_>
              ::operator[](__return_storage_ptr__,local_48);
    de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>::operator=
              (this_00,&local_58);
    de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>::~SharedPtr(&local_58);
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)6>_>::~Move(&local_98);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<FenceSp> createFences (const DeviceInterface&	vkd,
							  const VkDevice			device,
							  size_t					numFences)
{
	vector<FenceSp> fences(numFences);

	for (size_t ndx = 0; ndx < numFences; ++ndx)
		fences[ndx] = FenceSp(new Unique<VkFence>(createFence(vkd, device)));

	return fences;
}